

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRLoader.cpp
# Opt level: O3

void __thiscall
Assimp::IRRImporter::GenerateGraph
          (IRRImporter *this,Node *root,aiNode *rootOut,aiScene *scene,BatchLoader *batch,
          vector<aiMesh_*,_std::allocator<aiMesh_*>_> *meshes,
          vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *anims,
          vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *attach,
          vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *materials,uint *defMatIdx)

{
  pointer *ppAVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  pointer ppaVar4;
  pointer ppaVar5;
  iterator __position;
  aiMesh *paVar6;
  pointer ppVar7;
  aiColor4D *paVar8;
  uint a;
  uint uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  Logger *pLVar11;
  uint *puVar12;
  ulong uVar13;
  aiNode **ppaVar14;
  aiNode *this_00;
  ulong uVar15;
  long lVar16;
  aiTextureMapping mode;
  char *message;
  uint uVar17;
  IRRImporter *pIVar18;
  aiMaterial *paVar19;
  pointer ppVar20;
  int iVar21;
  float fVar22;
  float fVar23;
  undefined4 extraout_XMM0_Db;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  int idx;
  float fStack_a4;
  undefined8 uStack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined8 local_88;
  pointer local_70;
  float local_68;
  float local_64;
  BatchLoader *local_60;
  IRRImporter *local_58;
  aiScene *local_50;
  _func_int **local_48;
  long local_38;
  
  ppaVar4 = (meshes->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  ppaVar5 = (meshes->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_60 = batch;
  local_58 = this;
  local_50 = scene;
  switch(root->type) {
  case CUBE:
    _idx = (pointer)StandardShapes::MakeMesh(StandardShapes::MakeHexahedron);
    pIVar18 = (IRRImporter *)meshes;
    std::vector<aiMesh*,std::allocator<aiMesh*>>::emplace_back<aiMesh*>
              ((vector<aiMesh*,std::allocator<aiMesh*>> *)meshes,(aiMesh **)&idx);
    fVar22 = root->sphereRadius;
    (root->scaling).x = fVar22 * (root->scaling).x;
    (root->scaling).y = (root->scaling).y * fVar22;
    (root->scaling).z = fVar22 * (root->scaling).z;
    CopyMaterial(pIVar18,materials,&root->materials,defMatIdx,
                 (meshes->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish[-1]);
    paVar19 = (materials->super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)._M_impl.
              super__Vector_impl_data._M_finish[-1];
    mode = aiTextureMapping_BOX;
    break;
  case MESH:
  case ANIMMESH:
    if ((root->meshPath)._M_string_length != 0) {
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)BatchLoader::GetImport(batch,root->id);
      if (paVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        pLVar11 = DefaultLogger::get();
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&idx,
                       "IRR: Unable to load external file: ",&root->meshPath);
        Logger::error(pLVar11,_idx);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_idx != &local_98) {
          operator_delete(_idx,local_98._M_allocated_capacity + 1);
        }
      }
      else {
        __position._M_current =
             (attach->
             super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        _idx = (pointer)paVar10;
        uStack_a0 = rootOut;
        if (__position._M_current ==
            (attach->
            super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::
          _M_realloc_insert<Assimp::AttachmentInfo>(attach,__position,(AttachmentInfo *)&idx);
        }
        else {
          (__position._M_current)->scene = (aiScene *)paVar10;
          (__position._M_current)->attachToNode = rootOut;
          ppAVar1 = &(attach->
                     super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppAVar1 = *ppAVar1 + 1;
        }
        if ((long)(root->materials).
                  super__Vector_base<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(root->materials).
                  super__Vector_base<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4 ==
            (ulong)*(uint *)(paVar10->_M_local_buf + 0x20)) {
          if (*(uint *)(paVar10->_M_local_buf + 0x20) != 0) {
            lVar16 = 0;
            uVar13 = 0;
            do {
              paVar19 = *(aiMaterial **)
                         ((long)*(aiMaterial ***)(paVar10->_M_local_buf + 0x28) + lVar16);
              if (paVar19 != (aiMaterial *)0x0) {
                aiMaterial::~aiMaterial(paVar19);
              }
              operator_delete(paVar19,0x10);
              *(undefined8 *)((long)*(aiMaterial ***)(paVar10->_M_local_buf + 0x28) + lVar16) =
                   *(undefined8 *)
                    ((long)&((root->materials).
                             super__Vector_base<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->first + lVar16 * 2);
              uVar13 = uVar13 + 1;
              lVar16 = lVar16 + 8;
            } while (uVar13 < *(uint *)(paVar10->_M_local_buf + 0x20));
          }
          if (*(uint *)(paVar10->_M_local_buf + 0x10) != 0) {
            uVar13 = 0;
            do {
              paVar6 = (*(aiMesh ***)(paVar10->_M_local_buf + 0x18))[uVar13];
              ppVar7 = (root->materials).
                       super__Vector_base<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              ppVar20 = ppVar7 + paVar6->mMaterialIndex;
              paVar19 = ppVar7[paVar6->mMaterialIndex].first;
              paVar8 = paVar6->mColors[0];
              uVar17 = paVar6->mNumVertices;
              uVar9 = uVar17;
              if ((uVar17 != 0 && paVar8 != (aiColor4D *)0x0) &&
                 (uVar9 = 1, (ppVar20->second & 1) != 0)) {
                if (1 < uVar17) {
                  lVar16 = 0;
                  fVar22 = paVar8->a;
                  do {
                    fVar23 = *(float *)((long)&paVar8[1].a + lVar16);
                    if ((fVar23 != fVar22) || (NAN(fVar23) || NAN(fVar22))) goto LAB_004427b7;
                    lVar16 = lVar16 + 0x10;
                    fVar22 = fVar23;
                  } while ((ulong)uVar17 * 0x10 + -0x10 != lVar16);
                }
                local_88 = paVar19;
                local_70 = ppVar20;
                pLVar11 = DefaultLogger::get();
                Logger::info(pLVar11,"IRR: Replacing mesh vertex alpha with common opacity");
                if (paVar6->mNumVertices != 0) {
                  lVar16 = 0xc;
                  uVar15 = 0;
                  do {
                    *(undefined4 *)((long)&paVar6->mColors[0]->r + lVar16) = 0x3f800000;
                    uVar15 = uVar15 + 1;
                    lVar16 = lVar16 + 0x10;
                  } while (uVar15 < paVar6->mNumVertices);
                }
                aiMaterial::AddBinaryProperty
                          (local_88,&paVar6->mColors[0]->a,4,"$mat.opacity",0,0,aiPTI_Float);
                uVar9 = paVar6->mNumVertices;
                paVar19 = local_88;
                ppVar20 = local_70;
              }
LAB_004427b7:
              if ((paVar6->mTextureCoords[1] != (aiVector3D *)0x0) && (uVar9 != 0)) {
                idx = 1;
                uVar17 = 1;
                if (((ppVar20->second & 0x10002) != 0) ||
                   (uVar17 = 6, (ppVar20->second >> 8 & 1) != 0)) {
                  aiMaterial::AddBinaryProperty(paVar19,&idx,4,"$tex.uvwsrc",uVar17,0,aiPTI_Integer)
                  ;
                }
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 < *(uint *)(paVar10->_M_local_buf + 0x10));
          }
        }
        else {
          pLVar11 = DefaultLogger::get();
          Logger::warn(pLVar11,
                       "IRR: Failed to match imported materials with the materials found in the IRR scene file"
                      );
        }
      }
    }
    goto switchD_004422e9_caseD_4;
  case SKYBOX:
    if (0x5f < (ulong)((long)(root->materials).
                             super__Vector_base<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(root->materials).
                            super__Vector_base<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::reserve
                (materials,
                 ((long)(materials->super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(materials->super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)
                        ._M_impl.super__Vector_impl_data._M_start >> 3) + 6);
      lVar16 = 0;
      do {
        std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::insert
                  (materials,
                   (const_iterator)
                   (materials->super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                   _M_impl.super__Vector_impl_data._M_finish,
                   (value_type *)
                   ((long)&((root->materials).
                            super__Vector_base<std::pair<aiMaterial_*,_unsigned_int>,_std::allocator<std::pair<aiMaterial_*,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->first + lVar16));
        lVar16 = lVar16 + 0x10;
      } while (lVar16 != 0x60);
      pIVar18 = (IRRImporter *)&stack0xffffffffffffffb8;
      std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::vector
                ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)&stack0xffffffffffffffb8,
                 materials);
      BuildSkybox(pIVar18,meshes,
                  (vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)&stack0xffffffffffffffb8);
      if (local_48 != (_func_int **)0x0) {
        operator_delete(local_48,local_38 - (long)local_48);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&idx,
                     "IRR.SkyBox_",&root->name);
      std::__cxx11::string::operator=((string *)&root->name,(string *)&idx);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_idx != &local_98) {
        operator_delete(_idx,local_98._M_allocated_capacity + 1);
      }
      pLVar11 = DefaultLogger::get();
      Logger::info(pLVar11,
                   "IRR: Loading skybox, this will require special handling to be displayed correctly"
                  );
      goto switchD_004422e9_caseD_4;
    }
    pLVar11 = DefaultLogger::get();
    message = "IRR: There should be six materials for a skybox";
    goto LAB_004424db;
  default:
    goto switchD_004422e9_caseD_4;
  case TERRAIN:
    pLVar11 = DefaultLogger::get();
    message = "IRR: Unsupported node - TERRAIN";
LAB_004424db:
    Logger::error(pLVar11,message);
    goto switchD_004422e9_caseD_4;
  case SPHERE:
    uVar9 = root->spherePolyCountY * root->spherePolyCountX;
    uVar17 = 2;
    if (99 < uVar9) {
      uVar17 = 4 - (uVar9 < 300);
    }
    _idx = (pointer)StandardShapes::MakeMesh(uVar17,StandardShapes::MakeSphere);
    pIVar18 = (IRRImporter *)meshes;
    std::vector<aiMesh*,std::allocator<aiMesh*>>::emplace_back<aiMesh*>
              ((vector<aiMesh*,std::allocator<aiMesh*>> *)meshes,(aiMesh **)&idx);
    fVar22 = root->sphereRadius * 0.5;
    uVar2 = (root->scaling).x;
    uVar3 = (root->scaling).y;
    (root->scaling).x = fVar22 * (float)uVar2;
    (root->scaling).y = fVar22 * (float)uVar3;
    (root->scaling).z = fVar22 * (root->scaling).z;
    CopyMaterial(pIVar18,materials,&root->materials,defMatIdx,
                 (meshes->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish[-1]);
    paVar19 = (materials->super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)._M_impl.
              super__Vector_impl_data._M_finish[-1];
    mode = aiTextureMapping_SPHERE;
  }
  uStack_a0 = (aiNode *)CONCAT44(uStack_a0._4_4_,0xbf800000);
  _idx = (pointer)0x0;
  SetupMapping(paVar19,mode,(aiVector3D *)&idx);
switchD_004422e9_caseD_4:
  iVar21 = (int)((ulong)((long)ppaVar4 - (long)ppaVar5) >> 3);
  uVar17 = (int)((ulong)((long)(meshes->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(meshes->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>).
                              _M_impl.super__Vector_impl_data._M_start) >> 3) - iVar21;
  if (uVar17 != 0) {
    rootOut->mNumMeshes = uVar17;
    puVar12 = (uint *)operator_new__((ulong)uVar17 << 2);
    rootOut->mMeshes = puVar12;
    uVar13 = 0;
    do {
      rootOut->mMeshes[uVar13] = iVar21 + (int)uVar13;
      uVar13 = uVar13 + 1;
    } while (uVar13 < rootOut->mNumMeshes);
  }
  uVar13 = (root->name)._M_string_length;
  if (uVar13 < 0x400) {
    (rootOut->mName).length = (ai_uint32)uVar13;
    memcpy((rootOut->mName).data,(root->name)._M_dataplus._M_p,uVar13);
    (rootOut->mName).data[uVar13] = '\0';
  }
  fVar22 = (root->rotation).x * 0.017453292;
  local_88 = (aiMaterial *)CONCAT44(local_88._4_4_,(root->rotation).y * 0.017453292);
  fVar25 = (root->rotation).z * 0.017453292;
  fVar23 = cosf(fVar22);
  local_70 = (pointer)CONCAT44(local_70._4_4_,fVar23);
  fVar22 = sinf(fVar22);
  local_64 = cosf((float)local_88);
  fVar23 = sinf((float)local_88);
  local_88 = (aiMaterial *)CONCAT44(extraout_XMM0_Db,fVar23);
  local_68 = cosf(fVar25);
  fVar23 = sinf(fVar25);
  (rootOut->mTransformation).a1 = local_64 * local_68;
  fVar24 = (float)local_88 * local_68 * fVar22 - local_70._0_4_ * fVar23;
  (rootOut->mTransformation).a2 = fVar24;
  fVar26 = fVar23 * fVar22 + local_70._0_4_ * (float)local_88 * local_68;
  (rootOut->mTransformation).a3 = fVar26;
  (rootOut->mTransformation).b1 = local_64 * fVar23;
  fVar27 = local_68 * local_70._0_4_ + fVar22 * fVar23 * (float)local_88;
  (rootOut->mTransformation).b2 = fVar27;
  fVar25 = fVar23 * (float)local_88 * local_70._0_4_ - fVar22 * local_68;
  (rootOut->mTransformation).b3 = fVar25;
  (rootOut->mTransformation).c1 = -(float)local_88;
  (rootOut->mTransformation).c2 = fVar22 * local_64;
  (rootOut->mTransformation).c3 = local_70._0_4_ * local_64;
  (rootOut->mTransformation).a1 = local_64 * local_68 * (root->scaling).x;
  (rootOut->mTransformation).b1 = local_64 * fVar23 * (root->scaling).x;
  (rootOut->mTransformation).c1 = -(float)local_88 * (root->scaling).x;
  (rootOut->mTransformation).a2 = fVar24 * (root->scaling).y;
  (rootOut->mTransformation).b2 = fVar27 * (root->scaling).y;
  (rootOut->mTransformation).c2 = fVar22 * local_64 * (root->scaling).y;
  (rootOut->mTransformation).a3 = fVar26 * (root->scaling).z;
  (rootOut->mTransformation).b3 = fVar25 * (root->scaling).z;
  (rootOut->mTransformation).c3 = local_70._0_4_ * local_64 * (root->scaling).z;
  (rootOut->mTransformation).a4 = (root->position).x + (rootOut->mTransformation).a4;
  (rootOut->mTransformation).b4 = (root->position).y + (rootOut->mTransformation).b4;
  (rootOut->mTransformation).c4 = (root->position).z + (rootOut->mTransformation).c4;
  ComputeAnimations(local_58,root,rootOut,anims);
  uVar13 = (long)(root->children).
                 super__Vector_base<Assimp::IRRImporter::Node_*,_std::allocator<Assimp::IRRImporter::Node_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(root->children).
                 super__Vector_base<Assimp::IRRImporter::Node_*,_std::allocator<Assimp::IRRImporter::Node_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  uVar17 = (uint)(uVar13 >> 3);
  rootOut->mNumChildren = uVar17;
  if (uVar17 != 0) {
    ppaVar14 = (aiNode **)operator_new__(uVar13 & 0x7fffffff8);
    rootOut->mChildren = ppaVar14;
    uVar13 = 0;
    do {
      this_00 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_00);
      rootOut->mChildren[uVar13] = this_00;
      this_00->mParent = rootOut;
      GenerateGraph(local_58,(root->children).
                             super__Vector_base<Assimp::IRRImporter::Node_*,_std::allocator<Assimp::IRRImporter::Node_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar13],this_00,local_50,
                    local_60,meshes,anims,attach,materials,defMatIdx);
      uVar13 = uVar13 + 1;
    } while (uVar13 < rootOut->mNumChildren);
  }
  return;
}

Assistant:

void IRRImporter::GenerateGraph(Node* root,aiNode* rootOut ,aiScene* scene,
    BatchLoader& batch,
    std::vector<aiMesh*>&        meshes,
    std::vector<aiNodeAnim*>&    anims,
    std::vector<AttachmentInfo>& attach,
    std::vector<aiMaterial*>&    materials,
    unsigned int&                defMatIdx)
{
    unsigned int oldMeshSize = (unsigned int)meshes.size();
    //unsigned int meshTrafoAssign = 0;

    // Now determine the type of the node
    switch (root->type)
    {
    case Node::ANIMMESH:
    case Node::MESH:
        {
            if (!root->meshPath.length())
                break;

            // Get the loaded mesh from the scene and add it to
            // the list of all scenes to be attached to the
            // graph we're currently building
            aiScene* localScene = batch.GetImport(root->id);
            if (!localScene) {
                ASSIMP_LOG_ERROR("IRR: Unable to load external file: " + root->meshPath);
                break;
            }
            attach.push_back(AttachmentInfo(localScene,rootOut));

            // Now combine the material we've loaded for this mesh
            // with the real materials we got from the file. As we
            // don't execute any pp-steps on the file, the numbers
            // should be equal. If they are not, we can impossibly
            // do this  ...
            if (root->materials.size() != (unsigned int)localScene->mNumMaterials)   {
                ASSIMP_LOG_WARN("IRR: Failed to match imported materials "
                    "with the materials found in the IRR scene file");

                break;
            }
            for (unsigned int i = 0; i < localScene->mNumMaterials;++i)  {
                // Delete the old material, we don't need it anymore
                delete localScene->mMaterials[i];

                std::pair<aiMaterial*, unsigned int>& src = root->materials[i];
                localScene->mMaterials[i] = src.first;
            }

            // NOTE: Each mesh should have exactly one material assigned,
            // but we do it in a separate loop if this behaviour changes
            // in future.
            for (unsigned int i = 0; i < localScene->mNumMeshes;++i) {
                // Process material flags
                aiMesh* mesh = localScene->mMeshes[i];


                // If "trans_vertex_alpha" mode is enabled, search all vertex colors
                // and check whether they have a common alpha value. This is quite
                // often the case so we can simply extract it to a shared oacity
                // value.
                std::pair<aiMaterial*, unsigned int>& src = root->materials[mesh->mMaterialIndex];
                aiMaterial* mat = (aiMaterial*)src.first;

                if (mesh->HasVertexColors(0) && src.second & AI_IRRMESH_MAT_trans_vertex_alpha)
                {
                    bool bdo = true;
                    for (unsigned int a = 1; a < mesh->mNumVertices;++a)    {

                        if (mesh->mColors[0][a].a != mesh->mColors[0][a-1].a)   {
                            bdo = false;
                            break;
                        }
                    }
                    if (bdo)    {
                        ASSIMP_LOG_INFO("IRR: Replacing mesh vertex alpha with common opacity");

                        for (unsigned int a = 0; a < mesh->mNumVertices;++a)
                            mesh->mColors[0][a].a = 1.f;

                        mat->AddProperty(& mesh->mColors[0][0].a, 1, AI_MATKEY_OPACITY);
                    }
                }

                // If we have a second texture coordinate set and a second texture
                // (either lightmap, normalmap, 2layered material) we need to
                // setup the correct UV index for it. The texture can either
                // be diffuse (lightmap & 2layer) or a normal map (normal & parallax)
                if (mesh->HasTextureCoords(1))  {

                    int idx = 1;
                    if (src.second & (AI_IRRMESH_MAT_solid_2layer | AI_IRRMESH_MAT_lightmap))   {
                        mat->AddProperty(&idx,1,AI_MATKEY_UVWSRC_DIFFUSE(0));
                    }
                    else if (src.second & AI_IRRMESH_MAT_normalmap_solid)   {
                        mat->AddProperty(&idx,1,AI_MATKEY_UVWSRC_NORMALS(0));
                    }
                }
            }
        }
        break;

    case Node::LIGHT:
    case Node::CAMERA:

        // We're already finished with lights and cameras
        break;


    case Node::SPHERE:
        {
            // Generate the sphere model. Our input parameter to
            // the sphere generation algorithm is the number of
            // subdivisions of each triangle - but here we have
            // the number of poylgons on a specific axis. Just
            // use some hardcoded limits to approximate this ...
            unsigned int mul = root->spherePolyCountX*root->spherePolyCountY;
            if      (mul < 100)mul = 2;
            else if (mul < 300)mul = 3;
            else               mul = 4;

            meshes.push_back(StandardShapes::MakeMesh(mul,
                &StandardShapes::MakeSphere));

            // Adjust scaling
            root->scaling *= root->sphereRadius/2;

            // Copy one output material
            CopyMaterial(materials, root->materials, defMatIdx, meshes.back());

            // Now adjust this output material - if there is a first texture
            // set, setup spherical UV mapping around the Y axis.
            SetupMapping ( (aiMaterial*) materials.back(), aiTextureMapping_SPHERE);
        }
        break;

    case Node::CUBE:
        {
            // Generate an unit cube first
            meshes.push_back(StandardShapes::MakeMesh(
                &StandardShapes::MakeHexahedron));

            // Adjust scaling
            root->scaling *= root->sphereRadius;

            // Copy one output material
            CopyMaterial(materials, root->materials, defMatIdx, meshes.back());

            // Now adjust this output material - if there is a first texture
            // set, setup cubic UV mapping
            SetupMapping ( (aiMaterial*) materials.back(), aiTextureMapping_BOX );
        }
        break;


    case Node::SKYBOX:
        {
            // A skybox is defined by six materials
            if (root->materials.size() < 6) {
                ASSIMP_LOG_ERROR("IRR: There should be six materials for a skybox");
                break;
            }

            // copy those materials and generate 6 meshes for our new skybox
            materials.reserve(materials.size() + 6);
            for (unsigned int i = 0; i < 6;++i)
                materials.insert(materials.end(),root->materials[i].first);

            BuildSkybox(meshes,materials);

            // *************************************************************
            // Skyboxes will require a different code path for rendering,
            // so there must be a way for the user to add special support
            // for IRR skyboxes. We add a 'IRR.SkyBox_' prefix to the node.
            // *************************************************************
            root->name = "IRR.SkyBox_" + root->name;
            ASSIMP_LOG_INFO("IRR: Loading skybox, this will "
                "require special handling to be displayed correctly");
        }
        break;

    case Node::TERRAIN:
        {
            // to support terrains, we'd need to have a texture decoder
            ASSIMP_LOG_ERROR("IRR: Unsupported node - TERRAIN");
        }
        break;
    default:
        // DUMMY
        break;
    };

    // Check whether we added a mesh (or more than one ...). In this case
    // we'll also need to attach it to the node
    if (oldMeshSize != (unsigned int) meshes.size())    {

        rootOut->mNumMeshes = (unsigned int)meshes.size() - oldMeshSize;
        rootOut->mMeshes    = new unsigned int[rootOut->mNumMeshes];

        for (unsigned int a = 0; a  < rootOut->mNumMeshes;++a)  {
            rootOut->mMeshes[a] = oldMeshSize+a;
        }
    }

    // Setup the name of this node
    rootOut->mName.Set(root->name);

    // Now compute the final local transformation matrix of the
    // node from the given translation, rotation and scaling values.
    // (the rotation is given in Euler angles, XYZ order)
    //std::swap((float&)root->rotation.z,(float&)root->rotation.y);
    rootOut->mTransformation.FromEulerAnglesXYZ(AI_DEG_TO_RAD(root->rotation) );

    // apply scaling
    aiMatrix4x4& mat = rootOut->mTransformation;
    mat.a1 *= root->scaling.x;
    mat.b1 *= root->scaling.x;
    mat.c1 *= root->scaling.x;
    mat.a2 *= root->scaling.y;
    mat.b2 *= root->scaling.y;
    mat.c2 *= root->scaling.y;
    mat.a3 *= root->scaling.z;
    mat.b3 *= root->scaling.z;
    mat.c3 *= root->scaling.z;

    // apply translation
    mat.a4 += root->position.x;
    mat.b4 += root->position.y;
    mat.c4 += root->position.z;

    // now compute animations for the node
    ComputeAnimations(root,rootOut, anims);

    // Add all children recursively. First allocate enough storage
    // for them, then call us again
    rootOut->mNumChildren = (unsigned int)root->children.size();
    if (rootOut->mNumChildren)  {

        rootOut->mChildren = new aiNode*[rootOut->mNumChildren];
        for (unsigned int i = 0; i < rootOut->mNumChildren;++i) {

            aiNode* node = rootOut->mChildren[i] =  new aiNode();
            node->mParent = rootOut;
            GenerateGraph(root->children[i],node,scene,batch,meshes,
                anims,attach,materials,defMatIdx);
        }
    }
}